

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void display_tree_dfs(log_multi *b,node *node,uint32_t depth)

{
  ostream *poVar1;
  size_t sVar2;
  node_pred *pnVar3;
  uint in_EDX;
  log_multi *in_RSI;
  long in_RDI;
  size_t i_1;
  uint32_t i;
  ulong i_00;
  uint32_t depth_00;
  uint uVar4;
  
  for (uVar4 = 0; uVar4 < in_EDX; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&std::cout,"\t");
  }
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(uint)in_RSI->max_predictors);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)((long)&in_RSI->predictors_used + 4))
  ;
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,*(uint *)&in_RSI->progress);
  poVar1 = std::operator<<((ostream *)&std::cout," label = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)&in_RSI[1].nodes._begin);
  std::operator<<(poVar1," labels = ");
  i_00 = 0;
  while( true ) {
    sVar2 = v_array<node_pred>::size((v_array<node_pred> *)&in_RSI->nodes);
    if (sVar2 <= i_00) break;
    pnVar3 = v_array<node_pred>::operator[]((v_array<node_pred> *)&in_RSI->nodes,i_00);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,pnVar3->label);
    poVar1 = std::operator<<(poVar1,":");
    pnVar3 = v_array<node_pred>::operator[]((v_array<node_pred> *)&in_RSI->nodes,i_00);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pnVar3->label_count);
    std::operator<<(poVar1,"\t");
    i_00 = i_00 + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if ((in_RSI->max_predictors & 0x100000000) != 0) {
    std::operator<<((ostream *)&std::cout,"Left");
    v_array<node>::operator[]
              ((v_array<node> *)(in_RDI + 8),(ulong)*(uint *)((long)&in_RSI->predictors_used + 4));
    depth_00 = (uint32_t)(i_00 >> 0x20);
    display_tree_dfs(in_RSI,(node *)CONCAT44(in_EDX,uVar4),depth_00);
    std::operator<<((ostream *)&std::cout,"Right");
    v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*(uint *)&in_RSI->progress);
    display_tree_dfs(in_RSI,(node *)CONCAT44(in_EDX,uVar4),depth_00);
  }
  return;
}

Assistant:

void display_tree_dfs(log_multi& b, const node& node, uint32_t depth)
{
  for (uint32_t i = 0; i < depth; i++) cout << "\t";
  cout << node.min_count << " " << node.left << " " << node.right;
  cout << " label = " << node.max_count_label << " labels = ";
  for (size_t i = 0; i < node.preds.size(); i++)
    cout << node.preds[i].label << ":" << node.preds[i].label_count << "\t";
  cout << endl;

  if (node.internal)
  {
    cout << "Left";
    display_tree_dfs(b, b.nodes[node.left], depth + 1);

    cout << "Right";
    display_tree_dfs(b, b.nodes[node.right], depth + 1);
  }
}